

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dxil_resources.cpp
# Opt level: O0

Id dxil_spv::build_root_descriptor_access_chain(Impl *impl,uint member_index)

{
  StorageClass storageClass;
  Id IVar1;
  Builder *this;
  Operation *this_00;
  Operation *access_chain;
  Id ptr_type_id;
  StorageClass storage;
  Builder *builder;
  uint member_index_local;
  Impl *impl_local;
  
  this = Converter::Impl::builder(impl);
  storageClass = StorageClassPushConstant;
  if (((impl->options).inline_ubo_enable & 1U) != 0) {
    storageClass = StorageClassUniform;
  }
  IVar1 = spv::Builder::makeUintType(this,0x20);
  IVar1 = spv::Builder::makeVectorType(this,IVar1,2);
  IVar1 = spv::Builder::makePointer(this,storageClass,IVar1);
  this_00 = Converter::Impl::allocate(impl,OpAccessChain,IVar1);
  Operation::add_id(this_00,impl->root_constant_id);
  IVar1 = spv::Builder::makeUintConstant(this,member_index,false);
  Operation::add_id(this_00,IVar1);
  Converter::Impl::add(impl,this_00,false);
  return this_00->id;
}

Assistant:

static spv::Id build_root_descriptor_access_chain(Converter::Impl &impl, unsigned member_index)
{
	auto &builder = impl.builder();

	auto storage = impl.options.inline_ubo_enable ? spv::StorageClassUniform : spv::StorageClassPushConstant;

	spv::Id ptr_type_id = builder.makePointer(storage, builder.makeVectorType(builder.makeUintType(32), 2));
	auto *access_chain = impl.allocate(spv::OpAccessChain, ptr_type_id);
	access_chain->add_id(impl.root_constant_id);
	access_chain->add_id(builder.makeUintConstant(member_index));
	impl.add(access_chain);

	return access_chain->id;
}